

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void push_heap_suite::push_sequence(void)

{
  array<int,_15UL> *paVar1;
  int *piVar2;
  int local_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  array<int,_15UL> expect;
  int local_3c [3];
  
  local_90 = 0;
  uStack_88 = 0;
  local_80 = 0;
  local_a0 = 0;
  uStack_98 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  local_b4 = 8;
  vista::push_heap<false,int*,std::less<int&>>(&local_b4);
  piVar2 = local_3c;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[5] = 0;
  expect._M_elems[6] = 0;
  expect._M_elems[7] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  paVar1 = &expect;
  expect._M_elems[0] = 8;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x113,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,piVar2);
  local_b0 = CONCAT44(local_b0._4_4_,3);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,(long)&local_b0 + 4,piVar2,paVar1);
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[6] = 0;
  expect._M_elems[7] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  expect._M_elems[5] = 0;
  expect._M_elems[0] = 8;
  expect._M_elems[1] = 3;
  piVar2 = local_3c;
  paVar1 = &expect;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x11a,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,piVar2);
  local_b0 = CONCAT44(6,(undefined4)local_b0);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,&uStack_a8,piVar2,paVar1);
  expect._M_elems[0xb] = 0;
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[7] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  expect._M_elems[5] = 0;
  expect._M_elems[6] = 0;
  expect._M_elems[0] = 8;
  expect._M_elems[1] = 3;
  paVar1 = &expect;
  piVar2 = local_3c;
  expect._M_elems[2] = 6;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x121,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  uStack_a8 = CONCAT44(uStack_a8._4_4_,9);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,(long)&uStack_a8 + 4,piVar2,paVar1);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[4] = 0;
  expect._M_elems[5] = 0;
  expect._M_elems[6] = 0;
  expect._M_elems[7] = 0;
  expect._M_elems[0] = 9;
  expect._M_elems[1] = 8;
  expect._M_elems[2] = 6;
  expect._M_elems[3] = 3;
  paVar1 = &expect;
  piVar2 = local_3c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x128,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  uStack_a8 = CONCAT44(5,(undefined4)uStack_a8);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,&local_a0,piVar2,paVar1);
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[0xc] = 0;
  expect._M_elems[5] = 0;
  expect._M_elems[6] = 0;
  expect._M_elems[7] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[0] = 9;
  expect._M_elems[1] = 8;
  expect._M_elems[2] = 6;
  expect._M_elems[3] = 3;
  paVar1 = &expect;
  piVar2 = local_3c;
  expect._M_elems[4] = 5;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x12f,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  local_a0 = CONCAT44(local_a0._4_4_,2);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,(long)&local_a0 + 4,piVar2,paVar1);
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[6] = 0;
  expect._M_elems[7] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[0] = 9;
  expect._M_elems[1] = 8;
  expect._M_elems[2] = 6;
  expect._M_elems[3] = 3;
  expect._M_elems[4] = 5;
  expect._M_elems[5] = 2;
  paVar1 = &expect;
  piVar2 = local_3c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x136,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  local_a0 = CONCAT44(0xf,(undefined4)local_a0);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,&uStack_98,piVar2,paVar1);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[4] = 5;
  expect._M_elems[5] = 2;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 0;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 8;
  expect._M_elems[2] = 9;
  expect._M_elems[3] = 3;
  paVar1 = &expect;
  piVar2 = local_3c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x13d,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  uStack_98 = CONCAT44(uStack_98._4_4_,1);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,(long)&uStack_98 + 4,piVar2,paVar1);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 0;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[4] = 5;
  expect._M_elems[5] = 2;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 8;
  expect._M_elems[2] = 9;
  expect._M_elems[3] = 3;
  paVar1 = &expect;
  piVar2 = local_3c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x144,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  uStack_98 = CONCAT44(4,(undefined4)uStack_98);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,&local_90,piVar2,paVar1);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 0;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[4] = 5;
  expect._M_elems[5] = 2;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 8;
  expect._M_elems[2] = 9;
  expect._M_elems[3] = 4;
  paVar1 = &expect;
  piVar2 = local_3c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x14b,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  local_90 = CONCAT44(local_90._4_4_,0xc);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,(long)&local_90 + 4,piVar2,paVar1);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 5;
  expect._M_elems[10] = 0;
  expect._M_elems[0xb] = 0;
  expect._M_elems[4] = 8;
  expect._M_elems[5] = 2;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 0xc;
  expect._M_elems[2] = 9;
  expect._M_elems[3] = 4;
  paVar1 = &expect;
  piVar2 = local_3c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x152,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  local_90 = CONCAT44(7,(undefined4)local_90);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,&uStack_88,piVar2,paVar1);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 5;
  expect._M_elems[10] = 7;
  expect._M_elems[0xb] = 0;
  expect._M_elems[4] = 8;
  expect._M_elems[5] = 2;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 0xc;
  expect._M_elems[2] = 9;
  expect._M_elems[3] = 4;
  paVar1 = &expect;
  piVar2 = local_3c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x159,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  uStack_88 = CONCAT44(uStack_88._4_4_,10);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,(long)&uStack_88 + 4,piVar2,paVar1);
  expect._M_elems[0xc] = 0;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 5;
  expect._M_elems[10] = 7;
  expect._M_elems[0xb] = 2;
  expect._M_elems[4] = 8;
  expect._M_elems[5] = 9;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 0xc;
  expect._M_elems[2] = 10;
  expect._M_elems[3] = 4;
  paVar1 = &expect;
  piVar2 = local_3c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x160,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  uStack_88 = CONCAT44(0xd,(undefined4)uStack_88);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,&local_80,piVar2,paVar1);
  expect._M_elems[0xc] = 9;
  expect._M_elems[0xd] = 0;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 5;
  expect._M_elems[10] = 7;
  expect._M_elems[0xb] = 2;
  expect._M_elems[4] = 8;
  expect._M_elems[5] = 10;
  expect._M_elems[6] = 6;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 0xc;
  expect._M_elems[2] = 0xd;
  expect._M_elems[3] = 4;
  paVar1 = &expect;
  piVar2 = local_3c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x167,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  local_80 = CONCAT44(local_80._4_4_,0xb);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,(long)&local_80 + 4,piVar2,paVar1);
  expect._M_elems[0xc] = 9;
  expect._M_elems[0xd] = 6;
  expect._M_elems[0xe] = 0;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 5;
  expect._M_elems[10] = 7;
  expect._M_elems[0xb] = 2;
  expect._M_elems[4] = 8;
  expect._M_elems[5] = 10;
  expect._M_elems[6] = 0xb;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 0xc;
  expect._M_elems[2] = 0xd;
  expect._M_elems[3] = 4;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x16e,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  local_80 = CONCAT44(0xe,(undefined4)local_80);
  vista::push_heap<false,int*,std::less<int&>>(&local_b4,&expect);
  expect._M_elems[0xc] = 9;
  expect._M_elems[0xd] = 6;
  expect._M_elems[0xe] = 0xb;
  expect._M_elems[8] = 3;
  expect._M_elems[9] = 5;
  expect._M_elems[10] = 7;
  expect._M_elems[0xb] = 2;
  expect._M_elems[4] = 8;
  expect._M_elems[5] = 10;
  expect._M_elems[6] = 0xd;
  expect._M_elems[7] = 1;
  expect._M_elems[0] = 0xf;
  expect._M_elems[1] = 0xc;
  expect._M_elems[2] = 0xe;
  expect._M_elems[3] = 4;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x175,"void push_heap_suite::push_sequence()",&local_b4,expect._M_elems,
             expect._M_elems,local_3c);
  return;
}

Assistant:

void push_sequence()
{
    // 8 3 6 9 5 2 15 1 4 12 7 10 13 11 14

    std::array<int, 15> heap = {};
    auto last = heap.begin();
    *last++ = 8;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 8, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 3;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 8, 3, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 6;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 8, 3, 6, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 9;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 9, 8, 6, 3, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 5;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 9, 8, 6, 3, 5, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 2;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 9, 8, 6, 3, 5, 2, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 15;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 8, 9, 3, 5, 2, 6, 0, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 1;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 8, 9, 3, 5, 2, 6, 1, 0, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 4;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 8, 9, 4, 5, 2, 6, 1, 3, 0, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 12;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 9, 4, 8, 2, 6, 1, 3, 5, 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 7;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 9, 4, 8, 2, 6, 1, 3, 5, 7, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 10;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 10, 4, 8, 9, 6, 1, 3, 5, 7, 2, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 13;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 13, 4, 8, 10, 6, 1, 3, 5, 7, 2, 9, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 11;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 13, 4, 8, 10, 11, 1, 3, 5, 7, 2, 9, 6, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 14;
    vista::push_heap(heap.begin(), last);
    {
        std::array<int, 15> expect = { 15, 12, 14, 4, 8, 10, 13, 1, 3, 5, 7, 2, 9, 6, 11 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}